

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

double derivative_in_direction<dense_parameters>
                 (vw *param_1,bfgs *b,float *mem,int *origin,dense_parameters *weights)

{
  weight *pwVar1;
  byte bVar2;
  long lVar3;
  double dVar4;
  
  pwVar1 = weights->_begin;
  if (pwVar1 != pwVar1 + weights->_weight_mask + 1) {
    bVar2 = (byte)weights->_stride_shift;
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + (double)*(float *)((long)pwVar1 + lVar3 + 8) *
                      (double)mem[(long)(*origin % b->mem_stride) +
                                  ((ulong)(lVar3 >> 2) >> (bVar2 & 0x3f)) * (long)b->mem_stride];
      lVar3 = lVar3 + (1L << (bVar2 & 0x3f)) * 4;
    } while (weights->_weight_mask * 4 + 4 != lVar3);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double derivative_in_direction(vw& /* all */, bfgs& b, float* mem, int& origin, T& weights)
{
  double ret = 0.;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    ret += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * (&(*w))[W_DIR];
  }
  return ret;
}